

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O3

void __thiscall
TorController::auth_cb(TorController *this,TorControlConnection *_conn,TorControlReply *reply)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  Logger *this_00;
  CChainParams *pCVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  undefined1 local_9a [2];
  undefined1 local_98 [24];
  code *local_80;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (reply->code == 0xfa) {
    this_00 = LogInstance();
    bVar2 = BCLog::Logger::WillLogCategoryLevel(this_00,TOR,Debug);
    if (bVar2) {
      in_R9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/torcontrol.cpp"
      ;
      source_file._M_len = 0x5e;
      logging_function._M_str = "auth_cb";
      logging_function._M_len = 7;
      LogPrintFormatInternal<>
                (logging_function,source_file,0x1ca,TOR,Debug,(ConstevalFormatString<0U>)0xfaec26);
    }
    local_78._M_unused._M_object = &local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-onion","");
    local_98._0_8_ = local_98 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_9a + 2),"");
    ArgsManager::GetArg(&local_58,&gArgs,(string *)&local_78,(string *)(local_9a + 2));
    iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_58,"");
    paVar1 = &local_58.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_98._16_8_ + 1));
    }
    if ((code **)local_78._M_unused._0_8_ != &local_68) {
      operator_delete(local_78._M_unused._M_object,(ulong)(local_68 + 1));
    }
    if (iVar3 == 0) {
      local_58._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"GETINFO net/listeners/socks","");
      local_78._8_8_ = 0;
      local_78._M_unused._M_object = operator_new(0x18);
      *(code **)local_78._M_unused._0_8_ = get_socks_cb;
      *(code **)((long)local_78._M_unused._0_8_ + 8) = (code *)0x0;
      *(TorController **)((long)local_78._M_unused._0_8_ + 0x10) = this;
      local_60 = std::
                 _Function_handler<void_(TorControlConnection_&,_const_TorControlReply_&),_std::_Bind<void_(TorController::*(TorController_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(TorControlConnection_&,_const_TorControlReply_&)>_>
                 ::_M_invoke;
      local_68 = std::
                 _Function_handler<void_(TorControlConnection_&,_const_TorControlReply_&),_std::_Bind<void_(TorController::*(TorController_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(TorControlConnection_&,_const_TorControlReply_&)>_>
                 ::_M_manager;
      TorControlConnection::Command(_conn,&local_58,(ReplyHandlerCB *)&local_78);
      if (local_68 != (code *)0x0) {
        (*local_68)(&local_78,&local_78,3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar1) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    if ((this->private_key)._M_string_length == 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (&this->private_key,0,0,"NEW:ED25519-V3",0xe);
    }
    pCVar4 = Params();
    local_9a = (undefined1  [2])pCVar4->nDefaultPort;
    CService::ToStringAddrPort_abi_cxx11_((string *)&local_78,&this->m_target);
    tinyformat::format<std::__cxx11::string,unsigned_short,std::__cxx11::string>
              (&local_58,(tinyformat *)"ADD_ONION %s Port=%i,%s",(char *)&this->private_key,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9a,
               (unsigned_short *)local_78._M_pod_data,in_R9);
    local_98._8_8_ = 0;
    local_98._0_8_ = operator_new(0x18);
    *(code **)local_98._0_8_ = add_onion_cb;
    *(undefined8 *)(local_98._0_8_ + 8) = 0;
    *(TorController **)(local_98._0_8_ + 0x10) = this;
    local_80 = std::
               _Function_handler<void_(TorControlConnection_&,_const_TorControlReply_&),_std::_Bind<void_(TorController::*(TorController_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(TorControlConnection_&,_const_TorControlReply_&)>_>
               ::_M_invoke;
    local_98._16_8_ =
         std::
         _Function_handler<void_(TorControlConnection_&,_const_TorControlReply_&),_std::_Bind<void_(TorController::*(TorController_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(TorControlConnection_&,_const_TorControlReply_&)>_>
         ::_M_manager;
    TorControlConnection::Command(_conn,&local_58,(ReplyHandlerCB *)(local_9a + 2));
    if ((code *)local_98._16_8_ != (code *)0x0) {
      (*(code *)local_98._16_8_)(local_9a + 2,local_9a + 2,3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((code **)local_78._M_unused._0_8_ != &local_68) {
      operator_delete(local_78._M_unused._M_object,(ulong)(local_68 + 1));
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_00aafed0:
      __stack_chk_fail();
    }
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00aafed0;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/torcontrol.cpp"
    ;
    source_file_00._M_len = 0x5e;
    logging_function_00._M_str = "auth_cb";
    logging_function_00._M_len = 7;
    LogPrintFormatInternal<>
              (logging_function_00,source_file_00,0x1db,ALL,Info,(ConstevalFormatString<0U>)0xfaec84
              );
  }
  return;
}

Assistant:

void TorController::auth_cb(TorControlConnection& _conn, const TorControlReply& reply)
{
    if (reply.code == 250) {
        LogDebug(BCLog::TOR, "Authentication successful\n");

        // Now that we know Tor is running setup the proxy for onion addresses
        // if -onion isn't set to something else.
        if (gArgs.GetArg("-onion", "") == "") {
            _conn.Command("GETINFO net/listeners/socks", std::bind(&TorController::get_socks_cb, this, std::placeholders::_1, std::placeholders::_2));
        }

        // Finally - now create the service
        if (private_key.empty()) { // No private key, generate one
            private_key = "NEW:ED25519-V3"; // Explicitly request key type - see issue #9214
        }
        // Request onion service, redirect port.
        // Note that the 'virtual' port is always the default port to avoid decloaking nodes using other ports.
        _conn.Command(strprintf("ADD_ONION %s Port=%i,%s", private_key, Params().GetDefaultPort(), m_target.ToStringAddrPort()),
            std::bind(&TorController::add_onion_cb, this, std::placeholders::_1, std::placeholders::_2));
    } else {
        LogPrintf("tor: Authentication failed\n");
    }
}